

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.h
# Opt level: O3

void __thiscall
SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::SomethingOrDouble(SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inSome)

{
  (this->SomeValue)._M_dataplus._M_p = (pointer)&(this->SomeValue).field_2;
  (this->SomeValue)._M_string_length = 0;
  (this->SomeValue).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  this->IsDouble = false;
  return;
}

Assistant:

SomethingOrDouble(T inSome){SomeValue = inSome;IsDouble = false;}